

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void __thiscall Liby::http::HttpServer::handleReadEvent(HttpServer *this,Connection *conn)

{
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  __node_base_ptr *pp_Var4;
  Connection *this_01;
  Buffer *this_02;
  bool bVar5;
  char *begin;
  char *pcVar6;
  off_t oVar7;
  mapped_type *pmVar8;
  Logger *this_03;
  __node_base_ptr *__n;
  int errcode;
  int __flags;
  undefined8 in_R8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined1 local_158 [16];
  code *local_148;
  code *pcStack_140;
  off_t local_138;
  __node_base_ptr *local_130;
  undefined1 local_128 [16];
  _Manager_type local_118;
  code *pcStack_110;
  __weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *local_108;
  Connection *local_100;
  RequestParser *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  Buffer *local_e8;
  fdPtr fp;
  weak_ptr<Liby::Connection> weak_conn_1;
  Reply rep;
  weak_ptr<Liby::Connection> weak_conn;
  
  __n = (__node_base_ptr *)
        (conn->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_130 = __n;
  if (__n == (__node_base_ptr *)0x0) {
    __assert_fail("conn.context_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp"
                  ,0x1d,"void Liby::http::HttpServer::handleReadEvent(Connection &)");
  }
  local_e8 = &conn->readBuf_;
  local_f8 = (RequestParser *)(__n + 2);
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__n + 3);
  local_108 = (__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)
              &conn->super_enable_shared_from_this<Liby::Connection>;
  this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)(__n + 0xb);
  local_100 = conn;
  while( true ) {
    bVar5 = Buffer::empty(local_e8);
    this_02 = local_e8;
    pp_Var4 = local_130;
    if (bVar5) {
      return;
    }
    iVar1 = *(int *)((long)local_130 + 0xb4);
    begin = Buffer::data(local_e8);
    pcVar6 = Buffer::data(this_02);
    oVar7 = Buffer::size(this_02);
    RequestParser::parse(local_f8,begin,pcVar6 + oVar7);
    Buffer::retrieve(this_02,(long)*(int *)((long)pp_Var4 + 0xb4) - (long)iVar1);
    this_01 = local_100;
    __flags = (int)in_R8;
    iVar1 = *(int *)(pp_Var4 + 0x16);
    if (5 < iVar1) {
      std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Liby::Connection,void>
                ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)&rep,local_108);
      std::__weak_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
      __weak_ptr<Liby::Connection,void>
                ((__weak_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)&weak_conn_1,
                 (__shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)&rep);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rep.content_);
      Reply::Error_abi_cxx11_((string *)&rep,(Reply *)0x194,errcode);
      std::__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                ((__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)local_128,
                 &weak_conn_1.super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>);
      local_148 = (code *)0x0;
      pcStack_140 = (code *)0x0;
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_158._0_8_ = operator_new(0x10);
      *(undefined8 *)local_158._0_8_ = local_128._0_8_;
      *(undefined8 *)(local_158._0_8_ + 8) = local_128._8_8_;
      local_128._0_8_ = (void *)0x0;
      local_128._8_8_ = 0;
      pcStack_140 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:45:42)>
                    ::_M_invoke;
      local_148 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:45:42)>
                  ::_M_manager;
      Connection::send(local_100,(int)&rep,local_158,(size_t)__n,__flags);
      std::_Function_base::~_Function_base((_Function_base *)local_158);
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
      std::__cxx11::string::~string((string *)&rep);
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                (&weak_conn_1.super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return;
    }
    if (iVar1 != 5) {
      return;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rep,
                   &this->root_,local_f0);
    FileDescriptor::openFile((FileDescriptor *)&fp,(string *)&rep);
    std::__cxx11::string::~string((string *)&rep);
    if (fp.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) break;
    oVar7 = FileDescriptor::getFileSize
                      (fp.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    rep.content_.rightIndex_ = 0;
    rep.content_.capacity_ = 0;
    rep.content_.buffer_ = (char *)0x0;
    rep.content_.leftIndex_ = 0;
    __n = &rep.headers_._M_h._M_single_bucket;
    rep.headers_._M_h._M_bucket_count = 1;
    rep.headers_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    rep.headers_._M_h._M_element_count = 0;
    rep.headers_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    rep.headers_._M_h._M_rehash_policy._M_next_resize = 0;
    rep.headers_._M_h._M_single_bucket = (__node_base_ptr)0x0;
    rep.status_ = 200;
    rep.headers_._M_h._M_buckets = __n;
    std::__cxx11::to_string((string *)local_158,oVar7);
    std::__cxx11::string::string((string *)&weak_conn_1,"Content-Length",(allocator *)local_128);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&rep.headers_,(string *)&weak_conn_1);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)local_158);
    std::__cxx11::string::~string((string *)&weak_conn_1);
    std::__cxx11::string::~string((string *)local_158);
    getMimeType((string *)local_158,local_f0);
    std::__cxx11::string::string((string *)&weak_conn_1,"Content-Type",(allocator *)local_128);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&rep.headers_,(string *)&weak_conn_1);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)local_158);
    std::__cxx11::string::~string((string *)&weak_conn_1);
    std::__cxx11::string::~string((string *)local_158);
    std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Liby::Connection,void>
              ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)local_158,local_108);
    std::__weak_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<Liby::Connection,void>
              ((__weak_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)
               &weak_conn.super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)local_158);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
    Reply::toString_abi_cxx11_((string *)&weak_conn_1,&rep);
    std::__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2> *)local_158,
               &fp.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>);
    std::__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              ((__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)&local_148,
               &weak_conn.super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>);
    local_128._0_8_ = (void *)0x0;
    local_128._8_8_ = 0;
    local_118 = (_Manager_type)0x0;
    pcStack_110 = (code *)0x0;
    local_138 = oVar7;
    local_128._0_8_ = operator_new(0x28);
    uVar3 = local_158._8_8_;
    uVar2 = local_158._0_8_;
    local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_158._0_8_ = (pointer)0x0;
    *(undefined8 *)local_128._0_8_ = uVar2;
    *(undefined8 *)(local_128._0_8_ + 8) = uVar3;
    *(code **)(local_128._0_8_ + 0x10) = local_148;
    *(code **)(local_128._0_8_ + 0x18) = pcStack_140;
    local_148 = (code *)0x0;
    pcStack_140 = (code *)0x0;
    *(off_t *)(local_128._0_8_ + 0x20) = oVar7;
    pcStack_110 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:76:39)>
                  ::_M_invoke;
    local_118 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:76:39)>
                ::_M_manager;
    Connection::send(this_01,(int)(string *)&weak_conn_1,(_Function_base *)local_128,(size_t)__n,
                     (int)in_R8);
    std::_Function_base::~_Function_base((_Function_base *)local_128);
    handleReadEvent(Liby::Connection&)::$_1::~__1((__1 *)local_158);
    std::__cxx11::string::~string((string *)&weak_conn_1);
    std::__cxx11::string::string((string *)local_158,"Connection",(allocator *)&weak_conn_1);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](this_00,(key_type *)local_158);
    bVar5 = std::operator!=(pmVar8,"keep-alive");
    std::__cxx11::string::~string((string *)local_158);
    if (bVar5) {
      *(undefined1 *)(local_130 + 1) = 0;
    }
    else {
      RequestParser::clear(local_f8);
    }
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&weak_conn.super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    Reply::~Reply(&rep);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&fp.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    if (bVar5) {
      return;
    }
  }
  this_03 = Logger::getLogger();
  Logger::log(this_03,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fp.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void HttpServer::handleReadEvent(Connection &conn) {
    assert(conn.context_);

    HttpContext *context = static_cast<HttpContext *>(conn.context_.get());

    while (1) {
        Buffer &readBuf = conn.read();
        if (readBuf.empty())
            return;

        int savedBytes = context->requestParser.bytes_;
        context->requestParser.parse(readBuf.data(),
                                     readBuf.data() + readBuf.size());
        readBuf.retrieve(context->requestParser.bytes_ - savedBytes);

        if (context->requestParser.isError()) {
            std::weak_ptr<Connection> weak_conn(conn.shared_from_this());
            conn.send(Reply::Error(404), [weak_conn] {
                if (!weak_conn.expired()) {
                    auto conn = weak_conn.lock();
                    conn->destroy();
                }
            });
            break;
        } else if (context->requestParser.isGood()) {
            auto fp =
                FileDescriptor::openFile(root_ + context->requestParser.uri_);
            if (!fp) {
                error("fp is null");
                return;
            }

            long filesize;
            try {
                filesize = fp->getFileSize();
            } catch (const char *err) {
                error("%s", err);
                // send error response
                break;
            }

            Reply rep;
            rep.status_ = HTTP_OK;
            rep.headers_["Content-Length"] = std::to_string(filesize);
            rep.headers_["Content-Type"] =
                getMimeType(context->requestParser.uri_);

            std::weak_ptr<Connection> weak_conn(conn.shared_from_this());
            conn.send(rep.toString(), [fp, weak_conn, filesize] {
                if (!weak_conn.expired()) {
                    auto conn = weak_conn.lock();
                    conn->sendFile(fp, 0, filesize, [conn] {
                        HttpContext *context =
                            static_cast<HttpContext *>(conn->context_.get());
                        if (!context->keep_alive_)
                            conn->destroyLater();
                    });
                }
            });
            if (context->requestParser.headers_["Connection"] != "keep-alive") {
                context->keep_alive_ = false;
                break;
            }
            context->requestParser.clear();
        } else {
            break;
        }
    }
}